

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_checkpoint.cpp
# Opt level: O2

void ConcurrentCheckpoint::NopUpdate(DuckDB *db)

{
  long lVar1;
  bool bVar2;
  allocator local_89;
  long *local_88;
  long *local_80;
  long *local_78;
  string local_70 [32];
  Connection con;
  
  duckdb::Connection::Connection(&con,db);
  lVar1 = 10;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    std::__cxx11::string::string(local_70,"BEGIN TRANSACTION",&local_89);
    duckdb::Connection::Query((string *)&local_78);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
    local_78 = (long *)0x0;
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::string(local_70,"UPDATE accounts SET money = money",&local_89);
    duckdb::Connection::Query((string *)&local_80);
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    local_80 = (long *)0x0;
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::string(local_70,"COMMIT",&local_89);
    duckdb::Connection::Query((string *)&local_88);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
    local_88 = (long *)0x0;
    std::__cxx11::string::~string(local_70);
  }
  LOCK();
  finished_threads.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       ((long)finished_threads.super___atomic_base<unsigned_long>._M_i + 1);
  UNLOCK();
  if (finished_threads.super___atomic_base<unsigned_long>._M_i == 10) {
    LOCK();
    finished._M_base._M_i = (__atomic_base<bool>)true;
    UNLOCK();
  }
  duckdb::Connection::~Connection(&con);
  return;
}

Assistant:

static void NopUpdate(DuckDB *db) {
		Connection con(*db);
		for (size_t i = 0; i < 10; i++) {
			con.Query("BEGIN TRANSACTION");
			con.Query("UPDATE accounts SET money = money");
			con.Query("COMMIT");
		}
		finished_threads++;
		if (finished_threads == CONCURRENT_UPDATE_TOTAL_ACCOUNTS) {
			finished = true;
		}
	}